

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QWidgetItemData>::data(QList<QWidgetItemData> *this)

{
  QArrayDataPointer<QWidgetItemData> *this_00;
  QWidgetItemData *pQVar1;
  QArrayDataPointer<QWidgetItemData> *in_RDI;
  
  detach((QList<QWidgetItemData> *)0x8acd5c);
  this_00 = (QArrayDataPointer<QWidgetItemData> *)
            QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QWidgetItemData>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }